

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_if_connect_udp(mg_connection *nc)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar1 = socket(2,2,0);
  nc->sock = iVar1;
  if (iVar1 < 0) {
    nc->sock = -1;
    piVar2 = __errno_location();
    iVar3 = *piVar2 + (uint)(*piVar2 == 0);
  }
  nc->err = iVar3;
  return;
}

Assistant:

void mg_if_connect_udp(struct mg_connection *nc) {
    nc->sock = socket(AF_INET, SOCK_DGRAM, 0);
    if (nc->sock < 0) {
        nc->sock = INVALID_SOCKET;
        nc->err = errno ? errno : 1;
        return;
    }
    nc->err = 0;
}